

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSAXMLScanner.cpp
# Opt level: O2

bool __thiscall xercesc_4_0::XSAXMLScanner::scanStartTag(XSAXMLScanner *this,bool *gotData)

{
  ReaderMgr *this_00;
  XMLBufferMgr *this_01;
  bool bVar1;
  Grammar *pGVar2;
  XMLStringPool *pXVar3;
  XMLValidator *pXVar4;
  XMLDocumentHandler *pXVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  uint uriId;
  uint uVar10;
  GrammarType GVar11;
  StackElem *pSVar12;
  ComplexTypeInfo *pCVar13;
  XMLContentModel *cm;
  undefined4 extraout_var;
  XMLSize_t XVar14;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  XMLCh *pXVar15;
  undefined4 extraout_var_02;
  XMLCh *pXVar16;
  XMLBuffer *pXVar17;
  undefined4 extraout_var_03;
  SchemaElementDecl *this_02;
  XMLSize_t XVar18;
  int *piVar19;
  ElemStack *pEVar20;
  bool bVar21;
  bool isEmpty;
  uint local_c0;
  int prefixColonPos;
  XMLSize_t local_b8;
  uint local_ac;
  XMLCh *local_a8;
  ElemStack *local_a0;
  XMLSize_t local_98;
  XMLSize_t local_90;
  MemoryManager *local_88;
  bool *local_80;
  QName element;
  ContentLeafNameTypeVector *cv;
  
  *gotData = true;
  (this->super_SGXMLScanner).fContent.fIndex = 0;
  this_00 = &(this->super_SGXMLScanner).super_XMLScanner.fReaderMgr;
  pXVar17 = &(this->super_SGXMLScanner).super_XMLScanner.fQNameBuf;
  local_80 = gotData;
  bVar7 = ReaderMgr::getQName(this_00,pXVar17,&prefixColonPos);
  if (!bVar7) {
    XVar14 = pXVar17->fIndex;
    if (XVar14 == 0) {
      XMLScanner::emitError((XMLScanner *)this,ExpectedElementName);
    }
    else {
      pXVar16 = (this->super_SGXMLScanner).super_XMLScanner.fQNameBuf.fBuffer;
      pXVar16[XVar14] = L'\0';
      XMLScanner::emitError
                ((XMLScanner *)this,InvalidElementName,pXVar16,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
    }
    ReaderMgr::skipToChar(this_00,L'<');
    return bVar7;
  }
  pEVar20 = &(this->super_SGXMLScanner).super_XMLScanner.fElemStack;
  XVar14 = (this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStackTop;
  local_98 = XVar14;
  ReaderMgr::skipPastSpaces(this_00);
  local_a8 = (this->super_SGXMLScanner).super_XMLScanner.fQNameBuf.fBuffer;
  local_a8[(this->super_SGXMLScanner).super_XMLScanner.fQNameBuf.fIndex] = L'\0';
  local_90 = SGXMLScanner::rawAttrScan
                       (&this->super_SGXMLScanner,local_a8,(this->super_SGXMLScanner).fRawAttrList,
                        &isEmpty);
  local_c0 = 0xfffffffe;
  local_a0 = pEVar20;
  if (XVar14 == 0) {
LAB_002c4502:
    bVar8 = false;
LAB_002c4505:
    cm = (XMLContentModel *)0x0;
    cv = (ContentLeafNameTypeVector *)0x0;
  }
  else {
    pSVar12 = ElemStack::topElement(pEVar20);
    pCVar13 = (ComplexTypeInfo *)pSVar12->fThisElement[1].fId;
    piVar19 = (int *)&pSVar12->fThisElement->field_0x2c;
    if (pCVar13 != (ComplexTypeInfo *)0x0) {
      piVar19 = &pCVar13->fContentType;
    }
    if ((this->super_SGXMLScanner).super_XMLScanner.fValidate == true) {
      pCVar13 = SchemaValidator::getCurrentTypeInfo
                          ((SchemaValidator *)(this->super_SGXMLScanner).super_XMLScanner.fValidator
                          );
      if (pCVar13 != (ComplexTypeInfo *)0x0) {
        piVar19 = &pCVar13->fContentType;
        goto LAB_002c446a;
      }
LAB_002c44fd:
      bVar8 = true;
      goto LAB_002c4505;
    }
LAB_002c446a:
    if (2 < *piVar19 - 2U) {
      if (*piVar19 != 1) goto LAB_002c4502;
      goto LAB_002c44fd;
    }
    bVar8 = false;
    cm = ComplexTypeInfo::getContentModel(pCVar13,false);
    iVar9 = (*cm->_vptr_XMLContentModel[5])(cm);
    cv = (ContentLeafNameTypeVector *)CONCAT44(extraout_var,iVar9);
    local_c0 = (this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStack
               [(this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStackTop - 1]->fCurrentScope
    ;
  }
  XVar14 = ElemStack::addLevel(local_a0);
  pSVar12 = (this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStack
            [(this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStackTop - 1];
  pSVar12->fValidationFlag = (this->super_SGXMLScanner).super_XMLScanner.fValidate;
  pSVar12->fPrefixColonPos = prefixColonPos;
  if (local_90 != 0) {
    scanRawAttrListforNameSpaces(this,local_90);
  }
  pXVar16 = local_a8;
  uriId = XMLScanner::resolveQNameWithColon
                    ((XMLScanner *)this,local_a8,
                     &(this->super_SGXMLScanner).super_XMLScanner.fPrefixBuf,Mode_Element,
                     prefixColonPos);
  bVar1 = (this->super_SGXMLScanner).super_XMLScanner.fValidate;
  if (cv != (ContentLeafNameTypeVector *)0x0) {
    pXVar15 = (this->super_SGXMLScanner).super_XMLScanner.fPrefixBuf.fBuffer;
    pXVar15[(this->super_SGXMLScanner).super_XMLScanner.fPrefixBuf.fIndex] = L'\0';
    QName::QName(&element,pXVar15,pXVar16 + (long)prefixColonPos + 1,uriId,
                 (this->super_SGXMLScanner).super_XMLScanner.fMemoryManager);
    bVar8 = SGXMLScanner::laxElementValidation(&this->super_SGXMLScanner,&element,cv,cm,XVar14 - 1);
    QName::~QName(&element);
    pXVar16 = local_a8;
  }
  pXVar16 = pXVar16 + (long)prefixColonPos + 1;
  pGVar2 = (this->super_SGXMLScanner).super_XMLScanner.fGrammar;
  local_b8 = XVar14;
  iVar9 = (*(pGVar2->super_XSerializable)._vptr_XSerializable[0xb])(pGVar2,(ulong)uriId,pXVar16);
  this_02 = (SchemaElementDecl *)CONCAT44(extraout_var_00,iVar9);
  local_ac = (uint)bVar8;
  if (this_02 == (SchemaElementDecl *)0x0) {
    pXVar3 = (this->super_SGXMLScanner).super_XMLScanner.fURIStringPool;
    iVar9 = (*(((this->super_SGXMLScanner).super_XMLScanner.fGrammar)->super_XSerializable).
              _vptr_XSerializable[6])();
    uVar10 = (*(pXVar3->super_XSerializable)._vptr_XSerializable[9])
                       (pXVar3,CONCAT44(extraout_var_01,iVar9));
    if (uriId != uVar10) {
      pXVar15 = XMLScanner::getURIText((XMLScanner *)this,uriId);
      switchGrammar(this,pXVar15,SUB41(local_ac,0));
    }
    pGVar2 = (this->super_SGXMLScanner).super_XMLScanner.fGrammar;
    iVar9 = (*(pGVar2->super_XSerializable)._vptr_XSerializable[0xb])(pGVar2,(ulong)uriId,pXVar16);
    this_02 = (SchemaElementDecl *)CONCAT44(extraout_var_02,iVar9);
    if (this_02 == (SchemaElementDecl *)0x0) {
      this_02 = RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::
                getByKey((this->super_SGXMLScanner).fElemNonDeclPool,pXVar16,uriId,-2);
      XVar14 = local_b8;
      if (this_02 == (SchemaElementDecl *)0x0) {
        local_88 = (this->super_SGXMLScanner).super_XMLScanner.fMemoryManager;
        this_02 = (SchemaElementDecl *)XMemory::operator_new(0x80,local_88);
        pXVar15 = (this->super_SGXMLScanner).super_XMLScanner.fPrefixBuf.fBuffer;
        pXVar15[(this->super_SGXMLScanner).super_XMLScanner.fPrefixBuf.fIndex] = L'\0';
        SchemaElementDecl::SchemaElementDecl
                  (this_02,pXVar15,pXVar16,uriId,Any,0xfffffffe,
                   (this->super_SGXMLScanner).super_XMLScanner.fMemoryManager);
        XVar18 = RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::put
                           ((this->super_SGXMLScanner).fElemNonDeclPool,
                            ((this_02->super_XMLElementDecl).fElementName)->fLocalPart,uriId,-2,
                            this_02);
        (this_02->super_XMLElementDecl).fId = XVar18;
        bVar6 = true;
      }
      else {
        bVar6 = false;
      }
      goto LAB_002c469b;
    }
  }
  bVar6 = false;
  XVar14 = local_b8;
LAB_002c469b:
  pXVar4 = (this->super_SGXMLScanner).super_XMLScanner.fValidator;
  if (pXVar4 == (XMLValidator *)0x0) {
    bVar21 = false;
  }
  else {
    bVar21 = pXVar4[1].fReaderMgr != (ReaderMgr *)0x0;
  }
  if ((bVar6) || ((this_02->super_XMLElementDecl).fCreateReason != Declared)) {
    if (bVar8 == true && !bVar21) {
      (this->super_SGXMLScanner).super_XMLScanner.fValidate = false;
      (this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStack
      [(this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStackTop - 1]->fValidationFlag =
           false;
    }
    else if ((((this->super_SGXMLScanner).super_XMLScanner.fValidate & 1U) != 0) &&
            ((this_02->super_XMLElementDecl).fCreateReason = JustFaultIn, !bVar21)) {
      pXVar16 = XMLElementDecl::getFullName(&this_02->super_XMLElementDecl);
      XMLValidator::emitError
                (pXVar4,ElementNotDefined,pXVar16,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
    }
  }
  pEVar20 = local_a0;
  ElemStack::setElement
            (local_a0,&this_02->super_XMLElementDecl,
             ((this->super_SGXMLScanner).super_XMLScanner.fReaderMgr.fCurReader)->fReaderNum);
  XVar18 = local_98;
  (this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStack
  [(this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStackTop - 1]->fCurrentURI = uriId;
  if (local_98 == 0) {
    pXVar16 = XMLString::replicate
                        (local_a8,(this->super_SGXMLScanner).super_XMLScanner.fMemoryManager);
    (this->super_SGXMLScanner).super_XMLScanner.fRootElemName = pXVar16;
  }
  if ((this->super_SGXMLScanner).super_XMLScanner.fValidate == true) {
    pXVar4 = (this->super_SGXMLScanner).super_XMLScanner.fValidator;
    (*pXVar4->_vptr_XMLValidator[9])(pXVar4,this_02);
  }
  pXVar16 = (this->super_SGXMLScanner).super_XMLScanner.fQNameBuf.fBuffer;
  pXVar16[(this->super_SGXMLScanner).super_XMLScanner.fQNameBuf.fIndex] = L'\0';
  ElemStack::setCurrentSchemaElemName(pEVar20,pXVar16);
  if ((this->super_SGXMLScanner).super_XMLScanner.fValidate == true) {
    pCVar13 = SchemaValidator::getCurrentTypeInfo
                        ((SchemaValidator *)(this->super_SGXMLScanner).super_XMLScanner.fValidator);
  }
  else {
    pCVar13 = this_02->fComplexTypeInfo;
  }
  if (pCVar13 != (ComplexTypeInfo *)0x0) {
    local_c0 = pCVar13->fScopeDefined;
    pXVar16 = pCVar13->fTypeName;
    uVar10 = XMLString::indexOf(pXVar16,L',');
    pEVar20 = local_a0;
    XVar14 = local_b8;
    if (0 < (int)uVar10) {
      this_01 = &(this->super_SGXMLScanner).super_XMLScanner.fBufMgr;
      pXVar17 = XMLBufferMgr::bidOnBuffer(this_01);
      element.super_XSerializable._vptr_XSerializable = (_func_int **)pXVar17;
      element.fPrefixBufSz = (XMLSize_t)this_01;
      XMLBuffer::append(pXVar17,pXVar16,(ulong)uVar10);
      pXVar16 = pXVar17->fBuffer;
      pXVar16[pXVar17->fIndex] = L'\0';
      switchGrammar(this,pXVar16,SUB41(local_ac,0));
      XMLBufBid::~XMLBufBid((XMLBufBid *)&element);
      pEVar20 = local_a0;
      XVar18 = local_98;
      XVar14 = local_b8;
    }
  }
  pSVar12 = (this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStack
            [(this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStackTop - 1];
  pSVar12->fCurrentScope = local_c0;
  if ((this->super_SGXMLScanner).fElemStateSize <= XVar14) {
    SGXMLScanner::resizeElemState(&this->super_SGXMLScanner);
    pSVar12 = (this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStack
              [(this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStackTop - 1];
  }
  (this->super_SGXMLScanner).fElemState[XVar14] = 0;
  (this->super_SGXMLScanner).fElemLoopState[XVar14] = 0;
  pSVar12->fCurrentGrammar = (this->super_SGXMLScanner).super_XMLScanner.fGrammar;
  if ((XVar18 != 0) && (bVar1 != false)) {
    ElemStack::addChild(pEVar20,(this_02->super_XMLElementDecl).fElementName,true);
  }
  XVar14 = SGXMLScanner::buildAttList
                     (&this->super_SGXMLScanner,(this->super_SGXMLScanner).fRawAttrList,local_90,
                      &this_02->super_XMLElementDecl,
                      (this->super_SGXMLScanner).super_XMLScanner.fAttrList);
  if (XVar14 != 0) {
    Hash2KeysSetOf<xercesc_4_0::StringHasher>::removeAll
              ((this->super_SGXMLScanner).fUndeclaredAttrRegistry);
  }
  pXVar5 = (this->super_SGXMLScanner).super_XMLScanner.fDocHandler;
  if (pXVar5 != (XMLDocumentHandler *)0x0) {
    pXVar16 = (this->super_SGXMLScanner).super_XMLScanner.fPrefixBuf.fBuffer;
    pXVar16[(this->super_SGXMLScanner).super_XMLScanner.fPrefixBuf.fIndex] = L'\0';
    (*pXVar5->_vptr_XMLDocumentHandler[0xb])
              (pXVar5,this_02,(ulong)uriId,pXVar16,
               (this->super_SGXMLScanner).super_XMLScanner.fAttrList,XVar14,0,(ulong)(XVar18 == 0));
  }
  if (isEmpty == true) {
    ElemStack::popTop(pEVar20);
    if (((this->super_SGXMLScanner).super_XMLScanner.fValidate == true) &&
       (pXVar4 = (this->super_SGXMLScanner).super_XMLScanner.fValidator,
       iVar9 = (*pXVar4->_vptr_XMLValidator[2])(pXVar4,this_02,0,0), (char)iVar9 == '\0')) {
      pXVar4 = (this->super_SGXMLScanner).super_XMLScanner.fValidator;
      pXVar16 = XMLElementDecl::getFullName(&this_02->super_XMLElementDecl);
      iVar9 = (*(this_02->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[0xd])
                        (this_02);
      XVar18 = local_98;
      XMLValidator::emitError
                (pXVar4,ElementNotValidForContent,pXVar16,(XMLCh *)CONCAT44(extraout_var_03,iVar9),
                 (XMLCh *)0x0,(XMLCh *)0x0);
    }
    pXVar5 = (this->super_SGXMLScanner).super_XMLScanner.fDocHandler;
    if (pXVar5 != (XMLDocumentHandler *)0x0) {
      (this->super_SGXMLScanner).super_XMLScanner.fPrefixBuf.fBuffer
      [(this->super_SGXMLScanner).super_XMLScanner.fPrefixBuf.fIndex] = L'\0';
      (*pXVar5->_vptr_XMLDocumentHandler[6])(pXVar5,this_02,(ulong)uriId,(ulong)(XVar18 == 0));
    }
    if (XVar18 == 0) {
      *local_80 = false;
    }
    else {
      pGVar2 = (this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStack
               [(this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStackTop - 1]->
               fCurrentGrammar;
      (this->super_SGXMLScanner).super_XMLScanner.fGrammar = pGVar2;
      GVar11 = (*(pGVar2->super_XSerializable)._vptr_XSerializable[5])();
      (this->super_SGXMLScanner).fGrammarType = GVar11;
      pXVar4 = (this->super_SGXMLScanner).super_XMLScanner.fValidator;
      (*pXVar4->_vptr_XMLValidator[0xb])
                (pXVar4,(this->super_SGXMLScanner).super_XMLScanner.fGrammar);
      (this->super_SGXMLScanner).super_XMLScanner.fValidate =
           (this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStack
           [(this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStackTop - 1]->fValidationFlag;
    }
  }
  return bVar7;
}

Assistant:

bool XSAXMLScanner::scanStartTag(bool& gotData)
{
    //  Assume we will still have data until proven otherwise. It will only
    //  ever be false if this is the root and its empty.
    gotData = true;

    // Reset element content
    fContent.reset();

    //  The current position is after the open bracket, so we need to read in
    //  in the element name.
    int prefixColonPos;
    if (!fReaderMgr.getQName(fQNameBuf, &prefixColonPos))
    {
        if (fQNameBuf.isEmpty())
            emitError(XMLErrs::ExpectedElementName);
        else
            emitError(XMLErrs::InvalidElementName, fQNameBuf.getRawBuffer());
        fReaderMgr.skipToChar(chOpenAngle);
        return false;
    }

    // See if its the root element
    const bool isRoot = fElemStack.isEmpty();

    // Skip any whitespace after the name
    fReaderMgr.skipPastSpaces();

    //  First we have to do the rawest attribute scan. We don't do any
    //  normalization of them at all, since we don't know yet what type they
    //  might be (since we need the element decl in order to do that.)
    const XMLCh* qnameRawBuf = fQNameBuf.getRawBuffer();
    bool isEmpty;
    XMLSize_t attCount = rawAttrScan(qnameRawBuf, *fRawAttrList, isEmpty);

    // save the contentleafname and currentscope before addlevel, for later use
    ContentLeafNameTypeVector* cv = 0;
    XMLContentModel* cm = 0;
    unsigned int currentScope = Grammar::TOP_LEVEL_SCOPE;
    bool laxThisOne = false;
    if (!isRoot)
    {
        // schema validator will have correct type if validating
        SchemaElementDecl* tempElement = (SchemaElementDecl*)
            fElemStack.topElement()->fThisElement;
        SchemaElementDecl::ModelTypes modelType = tempElement->getModelType();
        ComplexTypeInfo *currType = 0;

        if (fValidate)
        {
            currType = ((SchemaValidator*)fValidator)->getCurrentTypeInfo();
            if (currType)
                modelType = (SchemaElementDecl::ModelTypes)currType->getContentType();
            else // something must have gone wrong
                modelType = SchemaElementDecl::Any;
        }
        else {
            currType = tempElement->getComplexTypeInfo();
        }

        if ((modelType == SchemaElementDecl::Mixed_Simple)
          ||  (modelType == SchemaElementDecl::Mixed_Complex)
          ||  (modelType == SchemaElementDecl::Children))
        {
            cm = currType->getContentModel();
            cv = cm->getContentLeafNameTypeVector();
            currentScope = fElemStack.getCurrentScope();
        }
        else if (modelType == SchemaElementDecl::Any) {
            laxThisOne = true;
        }
    }

    //  Now, since we might have to update the namespace map for this element,
    //  but we don't have the element decl yet, we just tell the element stack
    //  to expand up to get ready.
    XMLSize_t elemDepth = fElemStack.addLevel();
    fElemStack.setValidationFlag(fValidate);
    fElemStack.setPrefixColonPos(prefixColonPos);

    //  Make an initial pass through the list and find any xmlns attributes or
    //  schema attributes.
    if (attCount)
        scanRawAttrListforNameSpaces(attCount);

    //  Resolve the qualified name to a URI and name so that we can look up
    //  the element decl for this element. We have now update the prefix to
    //  namespace map so we should get the correct element now.
    unsigned int uriId = resolveQNameWithColon
    (
        qnameRawBuf, fPrefixBuf, ElemStack::Mode_Element, prefixColonPos
    );

    //if schema, check if we should lax or skip the validation of this element
    bool parentValidation = fValidate;
    if (cv) {
        QName element(fPrefixBuf.getRawBuffer(), &qnameRawBuf[prefixColonPos + 1], uriId, fMemoryManager);
        // elementDepth will be > 0, as cv is only constructed if element is not
        // root.
        laxThisOne = laxElementValidation(&element, cv, cm, elemDepth - 1);
    }

    //  Look up the element now in the grammar. This will get us back a
    //  generic element decl object. We tell him to fault one in if he does
    //  not find it.
    bool wasAdded = false;
    const XMLCh* nameRawBuf = &qnameRawBuf[prefixColonPos + 1];
    XMLElementDecl* elemDecl = fGrammar->getElemDecl
    (
        uriId, nameRawBuf, qnameRawBuf, currentScope
    );

    if (!elemDecl)
    {
        // URI is different, so we try to switch grammar
        if (uriId != fURIStringPool->getId(fGrammar->getTargetNamespace())) {
            switchGrammar(getURIText(uriId), laxThisOne);
        }

        // look for a global element declaration
        elemDecl = fGrammar->getElemDecl(
            uriId, nameRawBuf, qnameRawBuf, Grammar::TOP_LEVEL_SCOPE
        );

        if (!elemDecl)
        {
            // if still not found, look in list of undeclared elements
            elemDecl = fElemNonDeclPool->getByKey(
                nameRawBuf, uriId, (int)Grammar::TOP_LEVEL_SCOPE);

            if (!elemDecl)
            {
                elemDecl = new (fMemoryManager) SchemaElementDecl
                (
                    fPrefixBuf.getRawBuffer(), nameRawBuf, uriId
                    , SchemaElementDecl::Any, Grammar::TOP_LEVEL_SCOPE
                    , fMemoryManager
                );

                elemDecl->setId (fElemNonDeclPool->put(
                      (void*)elemDecl->getBaseName(),
                      uriId,
                      (int)Grammar::TOP_LEVEL_SCOPE,
                      (SchemaElementDecl*)elemDecl));

                wasAdded = true;
            }
		}
    }

    //  We do something different here according to whether we found the
    //  element or not.
    bool bXsiTypeSet= (fValidator)?((SchemaValidator*)fValidator)->getIsXsiTypeSet():false;
    if (wasAdded || !elemDecl->isDeclared())
    {
        if (laxThisOne && !bXsiTypeSet) {
            fValidate = false;
            fElemStack.setValidationFlag(fValidate);
        }

        // If validating then emit an error
        if (fValidate)
        {
            // This is to tell the reuse Validator that this element was
            // faulted-in, was not an element in the grammar pool originally
            elemDecl->setCreateReason(XMLElementDecl::JustFaultIn);

            if(!bXsiTypeSet)
                fValidator->emitError
                (
                    XMLValid::ElementNotDefined, elemDecl->getFullName()
                );
        }
    }

    //  Now we can update the element stack to set the current element
    //  decl. We expanded the stack above, but couldn't store the element
    //  decl because we didn't know it yet.
    fElemStack.setElement(elemDecl, fReaderMgr.getCurrentReaderNum());
    fElemStack.setCurrentURI(uriId);

    if (isRoot) {
        fRootElemName = XMLString::replicate(qnameRawBuf, fMemoryManager);
    }

    //  Validate the element
    if (fValidate) {
        fValidator->validateElement(elemDecl);
    }

    // squirrel away the element's QName, so that we can do an efficient
    // end-tag match
    fElemStack.setCurrentSchemaElemName(fQNameBuf.getRawBuffer());

    ComplexTypeInfo* typeinfo = (fValidate)
        ? ((SchemaValidator*)fValidator)->getCurrentTypeInfo()
        : ((SchemaElementDecl*) elemDecl)->getComplexTypeInfo();

    if (typeinfo)
    {
        currentScope = typeinfo->getScopeDefined();

        // switch grammar if the typeinfo has a different grammar
        XMLCh* typeName = typeinfo->getTypeName();
        int comma = XMLString::indexOf(typeName, chComma);
        if (comma > 0)
        {
            XMLBufBid bbPrefix(&fBufMgr);
            XMLBuffer& prefixBuf = bbPrefix.getBuffer();

            prefixBuf.append(typeName, comma);
            switchGrammar(prefixBuf.getRawBuffer(), laxThisOne);
        }
    }
    fElemStack.setCurrentScope(currentScope);

    // Set element next state
    if (elemDepth >= fElemStateSize) {
        resizeElemState();
    }

    fElemState[elemDepth] = 0;
    fElemLoopState[elemDepth] = 0;
    fElemStack.setCurrentGrammar(fGrammar);

    //  If this is the first element and we are validating, check the root
    //  element.
    if (!isRoot && parentValidation) {
        fElemStack.addChild(elemDecl->getElementName(), true);
    }

    //  Now lets get the fAttrList filled in. This involves faulting in any
    //  defaulted and fixed attributes and normalizing the values of any that
    //  we got explicitly.
    //
    //  We update the attCount value with the total number of attributes, but
    //  it goes in with the number of values we got during the raw scan of
    //  explictly provided attrs above.
    attCount = buildAttList(*fRawAttrList, attCount, elemDecl, *fAttrList);

    if(attCount)
    {
        // clean up after ourselves:
        // clear the map used to detect duplicate attributes
        fUndeclaredAttrRegistry->removeAll();
    }

    // Since the element may have default values, call start tag now regardless if it is empty or not
    // If we have a document handler, then tell it about this start tag
    if (fDocHandler)
    {
        fDocHandler->startElement
        (
            *elemDecl, uriId, fPrefixBuf.getRawBuffer(), *fAttrList
            , attCount, false, isRoot
        );
    } // may be where we output something...

    //  If empty, validate content right now if we are validating and then
    //  pop the element stack top. Else, we have to update the current stack
    //  top's namespace mapping elements.
    if (isEmpty)
    {
        // Pop the element stack back off since it'll never be used now
        fElemStack.popTop();

        // If validating, then insure that its legal to have no content
        if (fValidate)
        {
            XMLSize_t failure;
            bool res = fValidator->checkContent(elemDecl, 0, 0, &failure);
            if (!res)
            {
                // REVISIT:  in the case of xsi:type, this may
                // return the wrong string...
                fValidator->emitError
                (
                    XMLValid::ElementNotValidForContent
                    , elemDecl->getFullName()
                    , elemDecl->getFormattedContentModel()
                );
            }
        }

        // If we have a doc handler, tell it about the end tag
        if (fDocHandler)
        {
            fDocHandler->endElement
            (
                *elemDecl, uriId, isRoot, fPrefixBuf.getRawBuffer()
            );
        }

        // If the elem stack is empty, then it was an empty root
        if (isRoot) {
            gotData = false;
        }
        else
        {
            // Restore the grammar
            fGrammar = fElemStack.getCurrentGrammar();
            fGrammarType = fGrammar->getGrammarType();
            fValidator->setGrammar(fGrammar);

            // Restore the validation flag
            fValidate = fElemStack.getValidationFlag();
        }
    }

    return true;
}